

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrtf.h
# Opt level: O2

void __thiscall
SqrtfTest::SqrtfTest
          (SqrtfTest *this,input_generator_t *inputGenerator,input_range_t *inputRange,
          uint64_t samplesInRange)

{
  input_range_t inputRange_00;
  allocator<char> local_61;
  function<std::vector<float,_std::allocator<float>_>_(const_std::pair<float,_float>_&,_unsigned_long)>
  local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"sqrtf",&local_61);
  std::
  function<std::vector<float,_std::allocator<float>_>_(const_std::pair<float,_float>_&,_unsigned_long)>
  ::function(&local_60,inputGenerator);
  inputRange_00 = fixupInputRange(inputRange);
  Test<float,float,double>::Test<long_double(*)(long_double),float(*)(float)>
            ((Test<float,float,double> *)this,&local_40,&local_60,inputRange_00,samplesInRange,
             sqrtf_reference,dummyFunc);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

SqrtfTest(input_generator_t inputGenerator, const input_range_t& inputRange, uint64_t samplesInRange)
        : Test(
            "sqrtf", inputGenerator,
            fixupInputRange(inputRange), samplesInRange, &sqrtf_reference, &dummyFunc)
    {
    }